

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIASound.cpp
# Opt level: O0

void __thiscall
Atari2600::TIASound::apply_samples<(Outputs::Speaker::Action)2>
          (TIASound *this,size_t number_of_samples,MonoSample *target)

{
  ulong uVar1;
  int iVar2;
  uint local_34;
  int level;
  int divider_value;
  int channel;
  MonoSample output;
  uint c;
  MonoSample *target_local;
  size_t number_of_samples_local;
  TIASound *this_local;
  
  for (channel = 0; (uint)channel < number_of_samples; channel = channel + 1) {
    divider_value._2_2_ = 0;
    for (level = 0; level < 2; level = level + 1) {
      this->divider_counter_[level] = this->divider_counter_[level] + 1;
      iVar2 = this->divider_counter_[level] / 0x13;
      local_34 = 0;
      switch(this->control_[level]) {
      case '\0':
      case '\v':
        local_34 = 1;
        break;
      case '\x01':
        local_34 = this->poly4_counter_[level] & 1;
        if (iVar2 == this->divider_[level] + 1) {
          this->divider_counter_[level] = 0;
          this->poly4_counter_[level] =
               this->poly4_counter_[level] >> 1 |
               (this->poly4_counter_[level] << 3 ^ this->poly4_counter_[level] << 2) & 8U;
        }
        break;
      case '\x02':
        local_34 = this->poly4_counter_[level] & 1;
        if (iVar2 % (int)((this->divider_[level] + 1) * 0x1e) == 0x12) {
          this->poly4_counter_[level] =
               this->poly4_counter_[level] >> 1 |
               (this->poly4_counter_[level] << 3 ^ this->poly4_counter_[level] << 2) & 8U;
        }
        break;
      case '\x03':
        local_34 = this->output_state_[level];
        if (iVar2 == this->divider_[level] + 1) {
          if ((this->poly5_counter_[level] & 1U) != 0) {
            this->output_state_[level] = this->poly4_counter_[level] & 1;
            this->poly4_counter_[level] =
                 this->poly4_counter_[level] >> 1 |
                 (this->poly4_counter_[level] << 3 ^ this->poly4_counter_[level] << 2) & 8U;
          }
          this->poly5_counter_[level] =
               this->poly5_counter_[level] >> 1 |
               (this->poly5_counter_[level] << 4 ^ this->poly5_counter_[level] << 2) & 0x10U;
        }
        break;
      case '\x04':
      case '\x05':
        local_34 = iVar2 / (int)(this->divider_[level] + 1) & 1;
        break;
      case '\x06':
      case '\n':
        uVar1 = (long)iVar2 / (long)(int)(this->divider_[level] + 1);
        local_34 = (uint)((int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 |
                                      uVar1 & 0xffffffff) % 0x1e) < 0x13);
        break;
      case '\a':
      case '\t':
        local_34 = this->poly5_counter_[level] & 1;
        if (iVar2 == this->divider_[level] + 1) {
          this->divider_counter_[level] = 0;
          this->poly5_counter_[level] =
               this->poly5_counter_[level] >> 1 |
               (this->poly5_counter_[level] << 4 ^ this->poly5_counter_[level] << 2) & 0x10U;
        }
        break;
      case '\b':
        local_34 = this->poly9_counter_[level] & 1;
        if (iVar2 == this->divider_[level] + 1) {
          this->divider_counter_[level] = 0;
          this->poly9_counter_[level] =
               this->poly9_counter_[level] >> 1 |
               (this->poly9_counter_[level] << 4 ^ this->poly9_counter_[level] << 8) & 0x100U;
        }
        break;
      case '\f':
      case '\r':
        local_34 = iVar2 / (int)((this->divider_[level] + 1) * 3) & 1;
        break;
      case '\x0e':
        uVar1 = (long)iVar2 / (long)(int)((this->divider_[level] + 1) * 3);
        local_34 = (uint)((int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 |
                                      uVar1 & 0xffffffff) % 0x1e) < 0x13);
        break;
      case '\x0f':
        local_34 = this->poly5_counter_[level] & 1;
        if (iVar2 == (this->divider_[level] + 1) * 3) {
          this->divider_counter_[level] = 0;
          this->poly5_counter_[level] =
               this->poly5_counter_[level] >> 1 |
               (this->poly5_counter_[level] << 4 ^ this->poly5_counter_[level] << 2) & 0x10U;
        }
      }
      divider_value._2_2_ =
           divider_value._2_2_ +
           (short)((int)((uint)this->volume_[level] * (int)this->per_channel_volume_ * local_34) >>
                  4);
    }
    Outputs::Speaker::apply<(Outputs::Speaker::Action)2,short>
              (target + (uint)channel,divider_value._2_2_);
  }
  return;
}

Assistant:

void Atari2600::TIASound::apply_samples(std::size_t number_of_samples, Outputs::Speaker::MonoSample *target) {
	for(unsigned int c = 0; c < number_of_samples; c++) {
		Outputs::Speaker::MonoSample output = 0;
		for(int channel = 0; channel < 2; channel++) {
			divider_counter_[channel] ++;
			int divider_value = divider_counter_[channel] / (38 / CPUTicksPerAudioTick);
			int level = 0;
			switch(control_[channel]) {
				case 0x0: case 0xb:	// constant 1
					level = 1;
				break;

				case 0x4: case 0x5:	// div2 tone
					level = (divider_value / (divider_[channel]+1))&1;
				break;

				case 0xc: case 0xd:	// div6 tone
					level = (divider_value / ((divider_[channel]+1)*3))&1;
				break;

				case 0x6: case 0xa:	// div31 tone
					level = (divider_value / (divider_[channel]+1))%30 <= 18;
				break;

				case 0xe:			// div93 tone
					level = (divider_value / ((divider_[channel]+1)*3))%30 <= 18;
				break;

				case 0x1:			// 4-bit poly
					level = poly4_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly4(channel);
					}
				break;

				case 0x2:			// 4-bit poly div31
					level = poly4_counter_[channel]&1;
					if(divider_value%(30*(divider_[channel]+1)) == 18) {
						advance_poly4(channel);
					}
				break;

				case 0x3:			// 5/4-bit poly
					level = output_state_[channel];
					if(divider_value == divider_[channel]+1) {
						if(poly5_counter_[channel]&1) {
							output_state_[channel] = poly4_counter_[channel]&1;
							advance_poly4(channel);
						}
						advance_poly5(channel);
					}
				break;

				case 0x7: case 0x9:	// 5-bit poly
					level = poly5_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly5(channel);
					}
				break;

				case 0xf:			// 5-bit poly div6
					level = poly5_counter_[channel]&1;
					if(divider_value == (divider_[channel]+1)*3) {
						divider_counter_[channel] = 0;
						advance_poly5(channel);
					}
				break;

				case 0x8:			// 9-bit poly
					level = poly9_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly9(channel);
					}
				break;
			}

			output += (volume_[channel] * per_channel_volume_ * level) >> 4;
		}
		Outputs::Speaker::apply<action>(target[c], output);
	}
}